

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_pedersen_blind_sum
              (secp256k1_context *ctx,uchar *blind_out,uchar **blinds,size_t n,size_t npositive)

{
  int local_84;
  ulong uStack_80;
  int overflow;
  size_t i;
  secp256k1_scalar x;
  secp256k1_scalar acc;
  size_t npositive_local;
  size_t n_local;
  uchar **blinds_local;
  uchar *blind_out_local;
  secp256k1_context *ctx_local;
  
  if (blind_out == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"blind_out != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (blinds == (uchar **)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"blinds != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (n < npositive) {
    secp256k1_callback_call(&ctx->illegal_callback,"npositive <= n");
    ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_scalar_set_int((secp256k1_scalar *)(x.d + 3),0);
    for (uStack_80 = 0; uStack_80 < n; uStack_80 = uStack_80 + 1) {
      secp256k1_scalar_set_b32((secp256k1_scalar *)&i,blinds[uStack_80],&local_84);
      if (local_84 != 0) {
        return 0;
      }
      if (npositive <= uStack_80) {
        secp256k1_scalar_negate((secp256k1_scalar *)&i,(secp256k1_scalar *)&i);
      }
      secp256k1_scalar_add
                ((secp256k1_scalar *)(x.d + 3),(secp256k1_scalar *)(x.d + 3),(secp256k1_scalar *)&i)
      ;
    }
    secp256k1_scalar_get_b32(blind_out,(secp256k1_scalar *)(x.d + 3));
    secp256k1_scalar_clear((secp256k1_scalar *)(x.d + 3));
    secp256k1_scalar_clear((secp256k1_scalar *)&i);
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_pedersen_blind_sum(const secp256k1_context* ctx, unsigned char *blind_out, const unsigned char * const *blinds, size_t n, size_t npositive) {
    secp256k1_scalar acc;
    secp256k1_scalar x;
    size_t i;
    int overflow;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(blind_out != NULL);
    ARG_CHECK(blinds != NULL);
    ARG_CHECK(npositive <= n);
    (void) ctx;
    secp256k1_scalar_set_int(&acc, 0);
    for (i = 0; i < n; i++) {
        secp256k1_scalar_set_b32(&x, blinds[i], &overflow);
        if (overflow) {
            return 0;
        }
        if (i >= npositive) {
            secp256k1_scalar_negate(&x, &x);
        }
        secp256k1_scalar_add(&acc, &acc, &x);
    }
    secp256k1_scalar_get_b32(blind_out, &acc);
    secp256k1_scalar_clear(&acc);
    secp256k1_scalar_clear(&x);
    return 1;
}